

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O1

Btree tree_5_3::search_(Btree t,int e)

{
  int iVar1;
  
  while( true ) {
    if (t == (Btree)0x0) {
      return (Btree)0x0;
    }
    iVar1 = t->data;
    if (iVar1 == e) break;
    if (iVar1 <= e) {
      if (e <= iVar1) {
        return (Btree)0x0;
      }
      t = (Btree)&t->right;
    }
    t = t->left;
  }
  return t;
}

Assistant:

Btree search_(Btree t, int e) {
        if (t != nullptr) {
            if (t->data == e)
                return t;
            if (t->data > e)
                return search_(t->left, e);
            if (t->data < e)
                return search_(t->right, e);
        }
        return nullptr;
    }